

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

bool __thiscall option::Parser::StoreOptionAction::perform(StoreOptionAction *this,Option *option)

{
  Option *pOVar1;
  uint uVar2;
  Descriptor *ctx;
  Option *this_00;
  Parser *pPVar3;
  int iVar4;
  Option *pOVar5;
  Option *pOVar6;
  
  iVar4 = this->parser->op_count;
  if (this->bufmax < 0) {
    if (iVar4 == 0x7fffffff) {
      return false;
    }
  }
  else if (this->bufmax <= iVar4) {
    return true;
  }
  Option::init(this->buffer + iVar4,(EVP_PKEY_CTX *)option->desc);
  pPVar3 = this->parser;
  pOVar6 = this->options;
  iVar4 = pPVar3->op_count;
  pOVar1 = this->buffer + iVar4;
  ctx = this->buffer[iVar4].desc;
  uVar2 = ctx->index;
  this_00 = pOVar6 + (int)uVar2;
  if ((pOVar6 == (Option *)0x0) || (pOVar5 = this_00, pOVar6[(int)uVar2].desc == (Descriptor *)0x0))
  {
    Option::init(this_00,(EVP_PKEY_CTX *)ctx);
    pPVar3 = this->parser;
    iVar4 = pPVar3->op_count;
  }
  else {
    do {
      pOVar5 = pOVar5->prev_;
    } while (((ulong)pOVar5 & 1) == 0);
    do {
      pOVar6 = this_00;
      this_00 = pOVar6->prev_;
    } while (((ulong)pOVar6->prev_ & 1) == 0);
    ((Option *)((ulong)pOVar5 & 0xfffffffffffffffe))->next_ = pOVar1;
    pOVar1->prev_ = (Option *)((ulong)pOVar5 & 0xfffffffffffffffe);
    pOVar1->next_ = (Option *)((ulong)pOVar6 | 1);
    pOVar6->prev_ = (Option *)((ulong)pOVar1 | 1);
  }
  pPVar3->op_count = iVar4 + 1;
  return true;
}

Assistant:

bool perform(Option& option)
  {
    if (bufmax < 0 || parser.op_count < bufmax)
    {
      if (parser.op_count == 0x7fffffff)
        return false; // overflow protection: don't accept number of options that doesn't fit signed int

      buffer[parser.op_count] = option;
      int idx = buffer[parser.op_count].desc->index;
      if (options[idx])
        options[idx].append(buffer[parser.op_count]);
      else
        options[idx] = buffer[parser.op_count];
      ++parser.op_count;
    }
    return true; // NOTE: an option that is discarded because of a full buffer is not fatal
  }